

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_redraw(void)

{
  Term->total_erase = true;
  Term_fresh();
  return 0;
}

Assistant:

errr Term_redraw(void)
{
	/* Force "total erase" */
	Term->total_erase = true;

	/* Hack -- Refresh */
	Term_fresh();

	/* Success */
	return (0);
}